

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

fnode_service_state_t fnode_service_init_handler(fnode_service_t *svc)

{
  long lVar1;
  _Bool _Var2;
  undefined8 auStackY_100 [3];
  fnet_address_t *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  size_t es_num;
  size_t rs_num;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  ulong local_b0;
  size_t i;
  fcmd_hello cmd;
  fnet_address_t broadcast_addr;
  fnode_service_t *svc_local;
  
  auStackY_100[2] = 0x1029b2;
  _Var2 = fnet_str2addr(FNODE_BROADCAST_ADDR,(fnet_address_t *)(cmd.sn + 4));
  if (_Var2) {
    cmd.cmd = SUB84((ulong)*(undefined8 *)svc->sn >> 0x20,0);
    cmd.sn._0_4_ = *(undefined4 *)svc->dev_type;
    for (local_b0 = 0; local_b0 < svc->ifaces_num; local_b0 = local_b0 + 1) {
      auStackY_100[2] = 0x102a40;
      fnet_socket_sendto((fnet_socket_t)es_num,in_stack_ffffffffffffff28,
                         CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         in_stack_ffffffffffffff18);
    }
    lVar1 = (-0xe8 - (svc->ifaces_num * 4 + 0xf & 0xfffffffffffffff0)) -
            (svc->ifaces_num * 4 + 0xf & 0xfffffffffffffff0);
    *(undefined8 *)((long)auStackY_100 + lVar1 + 0xf0) = 1000;
    *(undefined8 *)((long)auStackY_100 + lVar1 + 0xe8) = 0x102afb;
    fnet_socket_select(*(fnet_socket_t **)(&stack0x000000d8 + lVar1 + 0xe8),
                       *(size_t *)(&stack0x000000d0 + lVar1 + 0xe8),
                       *(fnet_socket_t **)(&stack0x000000c8 + lVar1 + 0xe8),
                       *(size_t **)(&stack0x000000c0 + lVar1 + 0xe8),
                       *(fnet_socket_t **)(&stack0x000000b8 + lVar1 + 0xe8),
                       *(size_t **)(&stack0x000000b0 + lVar1 + 0xe8),
                       *(size_t *)(&stack0x000000f0 + lVar1 + 0xe8));
  }
  return FSVC_INIT;
}

Assistant:

fnode_service_state_t fnode_service_init_handler(fnode_service_t *svc)
{
    // get broadcast address
    fnet_address_t broadcast_addr;
    if (!fnet_str2addr(FNODE_BROADCAST_ADDR, &broadcast_addr))
    {
        FLOG_ERR("Invalid broadcast address");
        return FSVC_INIT;
    }

    // prepare command buffer
    fcmd_hello cmd = {{ FCMD_CHARS(FCMD_HELO) }};
    memcpy(cmd.sn,       svc->sn,       sizeof svc->sn);
    memcpy(cmd.dev_type, svc->dev_type, sizeof svc->dev_type);

    // broadcast hello message to each interface
    for(size_t i = 0; i < svc->ifaces_num; ++i)
        fnet_socket_sendto(svc->ifaces[i], (const char *)&cmd, sizeof cmd, &broadcast_addr);

    fnet_socket_t rs[svc->ifaces_num], es[svc->ifaces_num];
    size_t rs_num = 0, es_num = 0;
    if (fnet_socket_select(svc->ifaces, svc->ifaces_num, rs, &rs_num, es, &es_num, FNODE_HELLO_FREQ) && rs_num)
    {
        if (rs_num)
            svc->socket = rs[0];
        if (fnode_service_recv_cmd(svc) == FCMD_CONF)
            return FSVC_NOTIFY_STATUS;
    }

    return FSVC_INIT;
}